

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::getSpelling(MidiMessage *this,int *base7,int *accidental)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int local_30;
  int spelling;
  int base7pc;
  int base12pc;
  int octave;
  int base12;
  int *accidental_local;
  int *base7_local;
  MidiMessage *this_local;
  
  bVar1 = isNoteOn(this);
  if (bVar1) {
    *base7 = -0x1e240;
    *accidental = 0x1e240;
    iVar2 = getKeyNumber(this);
    base7pc = iVar2 / 0xc;
    local_30 = 0;
    uVar3 = getVelocity(this);
    uVar3 = uVar3 & 3;
    switch(iVar2 % 0xc) {
    case 0:
      switch(uVar3) {
      case 0:
      case 2:
        local_30 = 0;
        *accidental = 0;
        break;
      case 1:
        local_30 = 1;
        *accidental = -2;
        break;
      case 3:
        local_30 = 6;
        *accidental = 1;
        base7pc = base7pc + -1;
      }
      break;
    case 1:
      switch(uVar3) {
      case 0:
      case 2:
        local_30 = 0;
        *accidental = 1;
        break;
      case 1:
        local_30 = 1;
        *accidental = -1;
        break;
      case 3:
        local_30 = 6;
        *accidental = 2;
        base7pc = base7pc + -1;
      }
      break;
    case 2:
      switch(uVar3) {
      case 0:
      case 2:
        local_30 = 1;
        *accidental = 0;
        break;
      case 1:
        local_30 = 2;
        *accidental = -2;
        break;
      case 3:
        local_30 = 0;
        *accidental = 2;
      }
      break;
    case 3:
      switch(uVar3) {
      case 0:
      case 2:
        local_30 = 2;
        *accidental = -1;
        break;
      case 1:
        local_30 = 3;
        *accidental = -2;
        break;
      case 3:
        local_30 = 1;
        *accidental = 1;
      }
      break;
    case 4:
      switch(uVar3) {
      case 0:
      case 2:
        local_30 = 2;
        *accidental = 0;
        break;
      case 1:
        local_30 = 3;
        *accidental = -1;
        break;
      case 3:
        local_30 = 1;
        *accidental = 2;
      }
      break;
    case 5:
      switch(uVar3) {
      case 0:
      case 2:
        local_30 = 3;
        *accidental = 0;
        break;
      case 1:
        local_30 = 4;
        *accidental = -2;
        break;
      case 3:
        local_30 = 2;
        *accidental = 1;
      }
      break;
    case 6:
      switch(uVar3) {
      case 0:
      case 2:
        local_30 = 3;
        *accidental = 1;
        break;
      case 1:
        local_30 = 4;
        *accidental = -1;
        break;
      case 3:
        local_30 = 2;
        *accidental = 2;
      }
      break;
    case 7:
      switch(uVar3) {
      case 0:
      case 2:
        local_30 = 4;
        *accidental = 0;
        break;
      case 1:
        local_30 = 5;
        *accidental = -2;
        break;
      case 3:
        local_30 = 3;
        *accidental = 2;
      }
      break;
    case 8:
      switch(uVar3) {
      case 0:
      case 2:
        local_30 = 4;
        *accidental = 1;
        break;
      case 1:
        local_30 = 5;
        *accidental = -1;
        break;
      case 3:
        local_30 = 3;
        *accidental = 3;
      }
      break;
    case 9:
      switch(uVar3) {
      case 0:
      case 2:
        local_30 = 5;
        *accidental = 0;
        break;
      case 1:
        local_30 = 6;
        *accidental = -2;
        break;
      case 3:
        local_30 = 4;
        *accidental = 2;
      }
      break;
    case 10:
      switch(uVar3) {
      case 0:
      case 2:
        local_30 = 6;
        *accidental = -1;
        break;
      case 1:
        local_30 = 0;
        *accidental = -2;
        base7pc = base7pc + 1;
        break;
      case 3:
        local_30 = 5;
        *accidental = 1;
      }
      break;
    case 0xb:
      switch(uVar3) {
      case 0:
      case 2:
        local_30 = 6;
        *accidental = 0;
        break;
      case 1:
        local_30 = 0;
        *accidental = -1;
        base7pc = base7pc + 1;
        break;
      case 3:
        local_30 = 5;
        *accidental = 2;
      }
    }
    *base7 = local_30 + base7pc * 7;
  }
  return;
}

Assistant:

void MidiMessage::getSpelling(int& base7, int& accidental) {
	if (!isNoteOn()) {
		return;
	}
	base7 = -123456;
	accidental = 123456;
	int base12   = getKeyNumber();
	int octave   = base12 / 12;
	int base12pc = base12 - octave * 12;
	int base7pc  = 0;
	int spelling = 0x03 & getVelocity();

	// Table 5.1, page 101 in Beyond MIDI (1997)
	// http://beyondmidi.ccarh.org/beyondmidi-600dpi.pdf
	switch (base12pc) {

		case 0:
			switch (spelling) {
				        case 1: base7pc = 1; accidental = -2; break;  // Dbb
				case 0: case 2: base7pc = 0; accidental =  0; break;  // C
				        case 3: base7pc = 6; accidental = +1; octave--; break;  // B#
			}
			break;

		case 1:
			switch (spelling) {
				        case 1: base7pc = 1; accidental = -1; break;  // Db
				case 0: case 2: base7pc = 0; accidental = +1; break;  // C#
				        case 3: base7pc = 6; accidental = +2; octave--; break;  // B##
			}
			break;

		case 2:
			switch (spelling) {
				        case 1: base7pc = 2; accidental = -2; break;  // Ebb
				case 0: case 2: base7pc = 1; accidental =  0; break;  // D
				        case 3: base7pc = 0; accidental = +2; break;  // C##
			}
			break;

		case 3:
			switch (spelling) {
				        case 1: base7pc = 3; accidental = -2; break;  // Fbb
				case 0: case 2: base7pc = 2; accidental = -1; break;  // Eb
				        case 3: base7pc = 1; accidental = +1; break;  // D#
			}
			break;

		case 4:
			switch (spelling) {
				        case 1: base7pc = 3; accidental = -1; break;  // Fb
				case 0: case 2: base7pc = 2; accidental =  0; break;  // E
				        case 3: base7pc = 1; accidental = +2; break;  // D##
			}
			break;

		case 5:
			switch (spelling) {
				        case 1: base7pc = 4; accidental = -2; break;  // Gbb
				case 0: case 2: base7pc = 3; accidental =  0; break;  // F
				        case 3: base7pc = 2; accidental = +1; break;  // E#
			}
			break;

		case 6:
			switch (spelling) {
				        case 1: base7pc = 4; accidental = -1; break;  // Gb
				case 0: case 2: base7pc = 3; accidental = +1; break;  // F#
				        case 3: base7pc = 2; accidental = +2; break;  // E##
			}
			break;

		case 7:
			switch (spelling) {
				        case 1: base7pc = 5; accidental = -2; break;  // Abb
				case 0: case 2: base7pc = 4; accidental =  0; break;  // G
				        case 3: base7pc = 3; accidental = +2; break;  // F##
			}
			break;

		case 8:
			switch (spelling) {
				        case 1: base7pc = 5; accidental = -1; break;  // Ab
				case 0: case 2: base7pc = 4; accidental = +1; break;  // G#
				        case 3: base7pc = 3; accidental = +3; break;  // F###
			}
			break;

		case 9:
			switch (spelling) {
				        case 1: base7pc = 6; accidental = -2; break;  // Bbb
				case 0: case 2: base7pc = 5; accidental =  0; break;  // A
				        case 3: base7pc = 4; accidental = +2; break;  // G##
			}
			break;

		case 10:
			switch (spelling) {
				        case 1: base7pc = 0; accidental = -2; octave++; break;  // Cbb
				case 0: case 2: base7pc = 6; accidental = -1; break;  // Bb
				        case 3: base7pc = 5; accidental = +1; break;  // A#
			}
			break;

		case 11:
			switch (spelling) {
				        case 1: base7pc = 0; accidental = -1; octave++; break;  // Cb
				case 0: case 2: base7pc = 6; accidental =  0; break;  // B
				        case 3: base7pc = 5; accidental = +2; break;  // A##
			}
			break;

	}

	base7 = base7pc + 7 * octave;
}